

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# qgifhandler.cpp
# Opt level: O0

int __thiscall
QGIFFormat::decode(QGIFFormat *this,QImage *image,uchar *buffer,int length,int *nextFrameDelay,
                  int *loopCount)

{
  short sVar1;
  int iVar2;
  undefined1 auVar3 [16];
  undefined1 auVar4 [16];
  ushort uVar5;
  ushort uVar6;
  bool bVar7;
  Format FVar8;
  int iVar9;
  QRgb QVar10;
  int iVar11;
  short *psVar12;
  int *piVar13;
  ulong uVar14;
  QRgb *pQVar15;
  void *__s;
  size_t sVar16;
  long lVar17;
  long lVar18;
  byte bVar19;
  int in_ECX;
  byte *in_RDX;
  byte *pbVar20;
  QImage *in_RSI;
  QGIFFormat *in_RDI;
  int *in_R8;
  int *in_R9;
  long in_FS_OFFSET;
  bool havetrans;
  int delay;
  uint dBits;
  uchar index;
  QRgb *line;
  int h_1;
  int code;
  int i;
  int ln;
  uchar *dest_data;
  qsizetype dest_bpl;
  int b;
  int t;
  int r;
  int l;
  Format format;
  int newtop;
  int newleft;
  QRgb rgb;
  uchar ch;
  int initial;
  uchar *bits;
  qsizetype bpl;
  QSize bsSize;
  int h;
  int w;
  int newheight;
  int newwidth;
  QRgb in_stack_fffffffffffffe48;
  int in_stack_fffffffffffffe4c;
  undefined4 in_stack_fffffffffffffe50;
  undefined4 in_stack_fffffffffffffe54;
  uint in_stack_fffffffffffffe58;
  uint in_stack_fffffffffffffe5c;
  uint in_stack_fffffffffffffe60;
  Disposal in_stack_fffffffffffffe64;
  uint in_stack_fffffffffffffe68;
  undefined2 in_stack_fffffffffffffe6c;
  undefined1 in_stack_fffffffffffffe6e;
  undefined1 in_stack_fffffffffffffe6f;
  uint in_stack_fffffffffffffe70;
  undefined2 in_stack_fffffffffffffe74;
  undefined1 in_stack_fffffffffffffe76;
  undefined1 uVar21;
  undefined1 in_stack_fffffffffffffe77;
  QRgb in_stack_fffffffffffffe80;
  int in_stack_fffffffffffffea0;
  int in_stack_fffffffffffffea4;
  QGIFFormat *in_stack_fffffffffffffea8;
  int local_14c;
  uint local_130;
  bool local_129;
  void *local_100;
  uint local_f4;
  int local_f0;
  int local_ec;
  void *local_b0;
  long local_a8;
  int local_8c;
  byte *local_88;
  int local_6c;
  int local_60;
  int local_5c;
  QSize local_58;
  int local_50;
  int local_4c;
  int local_48;
  int local_44;
  int local_40;
  int local_3c;
  int local_38;
  int local_34 [3];
  int local_28 [2];
  QSize local_20;
  int local_18 [3];
  uint local_c;
  long local_8;
  
  local_8 = *(long *)(in_FS_OFFSET + 0x28);
  if (in_RDI->stack == (short *)0x0) {
    psVar12 = (short *)operator_new__(0x8000);
    in_RDI->stack = psVar12;
    in_RDI->table[0] = in_RDI->stack + 0x2000;
    in_RDI->table[1] = in_RDI->stack + 0x3000;
  }
  QImage::detach();
  local_a8 = QImage::bytesPerLine();
  local_b0 = (void *)QImage::bits();
  in_RDI->digress = false;
  local_8c = in_ECX;
  local_88 = in_RDX;
  do {
    if ((in_RDI->digress & 1U) != 0 || local_8c == 0) {
      local_6c = in_ECX - local_8c;
      goto LAB_00106bff;
    }
    local_8c = local_8c + -1;
    pbVar20 = local_88 + 1;
    bVar19 = *local_88;
    local_88 = pbVar20;
    switch(in_RDI->state) {
    case Header:
      iVar11 = in_RDI->count;
      in_RDI->count = iVar11 + 1;
      in_RDI->hold[iVar11] = bVar19;
      if (in_RDI->count == 6) {
        local_129 = true;
        if (in_RDI->hold[3] == '8') {
          local_129 = in_RDI->hold[4] != '7';
        }
        in_RDI->gif89 = local_129;
        in_RDI->state = LogicalScreenDescriptor;
        in_RDI->count = 0;
      }
      break;
    case LogicalScreenDescriptor:
      iVar11 = in_RDI->count;
      in_RDI->count = iVar11 + 1;
      in_RDI->hold[iVar11] = bVar19;
      if (in_RDI->count == 7) {
        in_RDI->swidth = (uint)*(ushort *)in_RDI->hold;
        in_RDI->sheight = (uint)*(ushort *)(in_RDI->hold + 2);
        in_RDI->gcmap = (in_RDI->hold[4] & 0x80) != 0;
        in_RDI->gncols = 2 << (in_RDI->hold[4] & 7);
        if ((in_RDI->gcmap & 1U) == 0) {
          local_130 = 0xffffffff;
        }
        else {
          local_130 = (uint)in_RDI->hold[5];
        }
        in_RDI->bgcol = local_130;
        in_RDI->trans_index = -1;
        in_RDI->count = 0;
        in_RDI->ncols = in_RDI->gncols;
        if ((in_RDI->gcmap & 1U) == 0) {
          in_RDI->state = Introducer;
        }
        else {
          in_RDI->ccount = 0;
          in_RDI->state = GlobalColorMap;
          auVar3._8_8_ = 0;
          auVar3._0_8_ = (long)(in_RDI->gncols + 1);
          uVar14 = SUB168(auVar3 * ZEXT816(4),0);
          if (SUB168(auVar3 * ZEXT816(4),8) != 0) {
            uVar14 = 0xffffffffffffffff;
          }
          pQVar15 = (QRgb *)operator_new__(uVar14);
          in_RDI->globalcmap = pQVar15;
          in_RDI->globalcmap[in_RDI->gncols] = 0xffffff;
        }
      }
      break;
    case GlobalColorMap:
    case LocalColorMap:
      iVar11 = in_RDI->count;
      in_RDI->count = iVar11 + 1;
      in_RDI->hold[iVar11] = bVar19;
      if (in_RDI->count == 3) {
        QVar10 = qRgb((uint)in_RDI->hold[0],(uint)in_RDI->hold[1],(uint)in_RDI->hold[2]);
        if (in_RDI->state == LocalColorMap) {
          if (in_RDI->ccount < in_RDI->lncols) {
            in_RDI->localcmap[in_RDI->ccount] = QVar10;
          }
        }
        else {
          in_RDI->globalcmap[in_RDI->ccount] = QVar10;
        }
        iVar11 = in_RDI->ccount + 1;
        in_RDI->ccount = iVar11;
        if (in_RDI->ncols <= iVar11) {
          if (in_RDI->state == LocalColorMap) {
            in_RDI->state = TableImageLZWSize;
          }
          else {
            in_RDI->state = Introducer;
          }
        }
        in_RDI->count = 0;
      }
      break;
    case Introducer:
      iVar11 = in_RDI->count;
      in_RDI->count = iVar11 + 1;
      in_RDI->hold[iVar11] = bVar19;
      if (bVar19 == 0x21) {
        in_RDI->state = ExtensionLabel;
      }
      else if (bVar19 == 0x2c) {
        in_RDI->state = ImageDescriptor;
      }
      else if (bVar19 == 0x3b) {
        in_RDI->state = Done;
      }
      else {
        in_RDI->digress = true;
        in_RDI->state = Error;
      }
      break;
    case ImageDescriptor:
      iVar11 = in_RDI->count;
      in_RDI->count = iVar11 + 1;
      in_RDI->hold[iVar11] = bVar19;
      if (in_RDI->count == 10) {
        uVar5 = *(ushort *)(in_RDI->hold + 1);
        uVar6 = *(ushort *)(in_RDI->hold + 3);
        local_c = (uint)*(ushort *)(in_RDI->hold + 5);
        local_18[2] = (int)*(ushort *)(in_RDI->hold + 7);
        iVar11 = in_RDI->swidth;
        local_18[1] = 0x4000;
        piVar13 = qMax<int>((int *)&local_c,local_18 + 1);
        if (*piVar13 < iVar11 / 10) {
          in_RDI->swidth = -1;
        }
        iVar11 = in_RDI->sheight;
        local_18[0] = 0x4000;
        piVar13 = qMax<int>(local_18 + 2,local_18);
        if (*piVar13 < iVar11 / 10) {
          in_RDI->sheight = -1;
        }
        if (in_RDI->swidth < 1) {
          in_RDI->swidth = uVar5 + local_c;
        }
        if (in_RDI->sheight < 1) {
          in_RDI->sheight = (uint)uVar6 + local_18[2];
        }
        FVar8 = Format_RGB32;
        if (-1 < in_RDI->trans_index) {
          FVar8 = Format_ARGB32;
        }
        uVar14 = QImage::isNull();
        if ((uVar14 & 1) != 0) {
          bVar7 = withinSizeLimit(in_RDI->swidth,in_RDI->sheight);
          if (!bVar7) {
            in_RDI->state = Error;
            local_6c = -1;
            goto LAB_00106bff;
          }
          QSize::QSize((QSize *)CONCAT44(in_stack_fffffffffffffe54,in_stack_fffffffffffffe50),
                       in_stack_fffffffffffffe4c,in_stack_fffffffffffffe48);
          uVar14 = QImageIOHandler::allocateImage(local_20,FVar8,in_RSI);
          if ((uVar14 & 1) == 0) {
            in_RDI->state = Error;
            local_6c = -1;
            goto LAB_00106bff;
          }
          local_a8 = QImage::bytesPerLine();
          local_b0 = (void *)QImage::bits();
          if (local_b0 != (void *)0x0) {
            sVar16 = QImage::sizeInBytes();
            memset(local_b0,0,sVar16);
          }
        }
        uVar14 = QImage::isNull();
        if ((uVar14 & 1) != 0) {
          in_RDI->state = Error;
          local_6c = -1;
          goto LAB_00106bff;
        }
        disposePrevious(in_stack_fffffffffffffea8,
                        (QImage *)CONCAT44(in_stack_fffffffffffffea4,in_stack_fffffffffffffea0));
        in_RDI->disposed = false;
        in_RDI->left = (uint)uVar5;
        in_RDI->top = (uint)uVar6;
        in_RDI->width = local_c;
        in_RDI->height = local_18[2];
        local_28[1] = 0;
        local_34[2] = in_RDI->left + in_RDI->width;
        piVar13 = qMin<int>(local_34 + 2,&in_RDI->swidth);
        local_28[0] = *piVar13 + -1;
        piVar13 = qMax<int>(local_28 + 1,local_28);
        in_RDI->right = *piVar13;
        local_34[1] = 0;
        local_38 = in_RDI->top + in_RDI->height;
        piVar13 = qMin<int>(&local_38,&in_RDI->sheight);
        local_34[0] = *piVar13 + -1;
        piVar13 = qMax<int>(local_34 + 1,local_34);
        in_RDI->bottom = *piVar13;
        in_RDI->lcmap = (in_RDI->hold[9] & 0x80) != 0;
        in_RDI->interlace = (uint)((in_RDI->hold[9] & 0x40) != 0);
        if ((in_RDI->lcmap & 1U) == 0) {
          local_14c = 0;
        }
        else {
          local_14c = 2 << (in_RDI->hold[9] & 7);
        }
        in_RDI->lncols = local_14c;
        if (in_RDI->lncols == 0) {
          in_RDI->ncols = in_RDI->gncols;
        }
        else {
          if ((in_RDI->localcmap != (QRgb *)0x0) &&
             (in_stack_fffffffffffffea8 = (QGIFFormat *)in_RDI->localcmap,
             in_stack_fffffffffffffea8 != (QGIFFormat *)0x0)) {
            operator_delete__(in_stack_fffffffffffffea8);
          }
          auVar4._8_8_ = 0;
          auVar4._0_8_ = (long)(in_RDI->lncols + 1);
          uVar14 = SUB168(auVar4 * ZEXT816(4),0);
          if (SUB168(auVar4 * ZEXT816(4),8) != 0) {
            uVar14 = 0xffffffffffffffff;
          }
          pQVar15 = (QRgb *)operator_new__(uVar14);
          in_RDI->localcmap = pQVar15;
          in_RDI->localcmap[in_RDI->lncols] = 0xffffff;
          in_RDI->ncols = in_RDI->lncols;
        }
        in_RDI->frame = in_RDI->frame + 1;
        if ((in_RDI->frame == 0) &&
           ((((in_RDI->left != 0 || (in_RDI->top != 0)) || (in_RDI->width < in_RDI->swidth)) ||
            (in_RDI->height < in_RDI->sheight)))) {
          if (in_RDI->trans_index < 0) {
            if (-1 < in_RDI->bgcol) {
              in_stack_fffffffffffffe48 = color(in_RDI,(uchar)in_RDI->bgcol);
              fillRect((QGIFFormat *)
                       CONCAT17(in_stack_fffffffffffffe77,
                                CONCAT16(in_stack_fffffffffffffe76,
                                         CONCAT24(in_stack_fffffffffffffe74,
                                                  in_stack_fffffffffffffe70))),
                       (QImage *)
                       CONCAT17(in_stack_fffffffffffffe6f,
                                CONCAT16(in_stack_fffffffffffffe6e,
                                         CONCAT24(in_stack_fffffffffffffe6c,
                                                  in_stack_fffffffffffffe68))),
                       in_stack_fffffffffffffe64,in_stack_fffffffffffffe60,in_stack_fffffffffffffe5c
                       ,in_stack_fffffffffffffe58,in_stack_fffffffffffffe80);
            }
          }
          else {
            in_stack_fffffffffffffea0 = in_RDI->swidth;
            in_stack_fffffffffffffea4 = in_RDI->sheight;
            in_stack_fffffffffffffe48 = color(in_RDI,(uchar)in_RDI->trans_index);
            fillRect((QGIFFormat *)
                     CONCAT17(in_stack_fffffffffffffe77,
                              CONCAT16(in_stack_fffffffffffffe76,
                                       CONCAT24(in_stack_fffffffffffffe74,in_stack_fffffffffffffe70)
                                      )),
                     (QImage *)
                     CONCAT17(in_stack_fffffffffffffe6f,
                              CONCAT16(in_stack_fffffffffffffe6e,
                                       CONCAT24(in_stack_fffffffffffffe6c,in_stack_fffffffffffffe68)
                                      )),in_stack_fffffffffffffe64,in_stack_fffffffffffffe60,
                     in_stack_fffffffffffffe5c,in_stack_fffffffffffffe58,in_stack_fffffffffffffe80);
          }
        }
        if (in_RDI->disposal == RestoreImage) {
          local_3c = in_RDI->swidth + -1;
          piVar13 = qMin<int>(&local_3c,&in_RDI->left);
          iVar11 = *piVar13;
          local_40 = in_RDI->swidth + -1;
          piVar13 = qMin<int>(&local_40,&in_RDI->right);
          iVar9 = *piVar13;
          local_44 = in_RDI->sheight + -1;
          piVar13 = qMin<int>(&local_44,&in_RDI->top);
          iVar2 = *piVar13;
          local_48 = in_RDI->sheight + -1;
          piVar13 = qMin<int>(&local_48,&in_RDI->bottom);
          local_4c = (iVar9 - iVar11) + 1;
          local_50 = (*piVar13 - iVar2) + 1;
          iVar9 = QImage::width();
          if ((iVar9 < local_4c) || (iVar9 = QImage::height(), iVar9 < local_50)) {
            bVar7 = withinSizeLimit(local_4c,local_50);
            if (!bVar7) {
              in_RDI->state = Error;
              local_6c = -1;
              goto LAB_00106bff;
            }
            local_58.wd.m_i = -0x55555556;
            local_58.ht.m_i = -0x55555556;
            local_5c = QImage::width();
            qMax<int>(&local_5c,&local_4c);
            local_60 = QImage::height();
            qMax<int>(&local_60,&local_50);
            QSize::QSize((QSize *)CONCAT44(in_stack_fffffffffffffe54,in_stack_fffffffffffffe50),
                         in_stack_fffffffffffffe4c,in_stack_fffffffffffffe48);
            uVar14 = QImageIOHandler::allocateImage(local_58,Format_RGB32,&in_RDI->backingstore);
            if ((uVar14 & 1) == 0) {
              in_RDI->state = Error;
              local_6c = -1;
              goto LAB_00106bff;
            }
            __s = (void *)QImage::bits();
            sVar16 = QImage::sizeInBytes();
            memset(__s,0,sVar16);
          }
          lVar17 = QImage::bytesPerLine();
          lVar18 = QImage::bits();
          for (local_ec = 0; local_ec < local_50; local_ec = local_ec + 1) {
            memcpy((void *)(lVar18 + local_ec * lVar17),
                   (void *)((long)local_b0 + (long)iVar11 * 4 + (iVar2 + local_ec) * local_a8),
                   (long)local_4c << 2);
          }
        }
        in_RDI->count = 0;
        if ((in_RDI->lcmap & 1U) == 0) {
          in_RDI->state = TableImageLZWSize;
        }
        else {
          in_RDI->ccount = 0;
          in_RDI->state = LocalColorMap;
        }
        in_RDI->x = in_RDI->left;
        in_RDI->y = in_RDI->top;
        in_RDI->accum = 0;
        in_RDI->bitcount = 0;
        in_RDI->sp = in_RDI->stack;
        in_RDI->oldcode = 0;
        in_RDI->firstcode = 0;
        in_RDI->needfirst = true;
        in_stack_fffffffffffffe77 = true;
        if (in_RDI->left < in_RDI->swidth) {
          in_stack_fffffffffffffe77 = in_RDI->sheight <= in_RDI->y;
        }
        in_RDI->out_of_bounds = (bool)in_stack_fffffffffffffe77;
      }
      break;
    case TableImageLZWSize:
      in_RDI->lzwsize = (uint)bVar19;
      if (in_RDI->lzwsize < 0xd) {
        in_RDI->code_size = in_RDI->lzwsize + 1;
        in_RDI->clear_code = 1 << ((byte)in_RDI->lzwsize & 0x1f);
        in_RDI->end_code = in_RDI->clear_code + 1;
        in_RDI->max_code_size = in_RDI->clear_code << 1;
        in_RDI->max_code = in_RDI->clear_code + 2;
        for (local_f0 = 0; local_f0 < in_RDI->clear_code; local_f0 = local_f0 + 1) {
          in_RDI->table[0][local_f0] = 0;
          in_RDI->table[1][local_f0] = (short)local_f0;
        }
        in_RDI->state = ImageDataBlockSize;
      }
      else {
        in_RDI->state = Error;
      }
      in_RDI->count = 0;
      break;
    case ImageDataBlockSize:
      in_RDI->expectcount = (uint)bVar19;
      if (in_RDI->expectcount == 0) {
        in_RDI->state = Introducer;
        in_RDI->digress = true;
        in_RDI->newFrame = true;
      }
      else {
        in_RDI->state = ImageDataBlock;
      }
      break;
    case ImageDataBlock:
      in_RDI->count = in_RDI->count + 1;
      if (in_RDI->bitcount != -0x8000) {
        if ((in_RDI->bitcount < 0) || (0x1f < in_RDI->bitcount)) {
          in_RDI->state = Error;
          local_6c = -1;
          goto LAB_00106bff;
        }
        in_RDI->accum = (uint)bVar19 << ((byte)in_RDI->bitcount & 0x1f) | in_RDI->accum;
        in_RDI->bitcount = in_RDI->bitcount + 8;
      }
      while( true ) {
        uVar21 = false;
        if (in_RDI->code_size <= in_RDI->bitcount) {
          uVar21 = in_RDI->state == ImageDataBlock;
        }
        if ((bool)uVar21 == false) break;
        in_stack_fffffffffffffe70 = in_RDI->accum;
        local_f4 = in_stack_fffffffffffffe70 & (1 << ((byte)in_RDI->code_size & 0x1f)) - 1U;
        in_RDI->bitcount = in_RDI->bitcount - in_RDI->code_size;
        in_RDI->accum = in_RDI->accum >> ((byte)in_RDI->code_size & 0x1f);
        if (local_f4 == in_RDI->clear_code) {
          if ((in_RDI->needfirst & 1U) == 0) {
            in_RDI->code_size = in_RDI->lzwsize + 1;
            in_RDI->max_code_size = in_RDI->clear_code << 1;
            in_RDI->max_code = in_RDI->clear_code + 2;
          }
          in_RDI->needfirst = true;
        }
        else if (local_f4 == in_RDI->end_code) {
          in_RDI->bitcount = -0x8000;
        }
        else if ((in_RDI->needfirst & 1U) == 0) {
          in_RDI->incode = local_f4;
          if (in_RDI->max_code <= (int)local_f4) {
            psVar12 = in_RDI->sp;
            in_RDI->sp = psVar12 + 1;
            *psVar12 = (short)in_RDI->firstcode;
            local_f4 = in_RDI->oldcode;
          }
          for (; in_RDI->clear_code + 2 <= (int)local_f4;
              local_f4 = (uint)in_RDI->table[0][(int)local_f4]) {
            if (in_RDI->max_code <= (int)local_f4) {
              in_RDI->state = Error;
              local_6c = -1;
              goto LAB_00106bff;
            }
            sVar1 = in_RDI->table[1][(int)local_f4];
            psVar12 = in_RDI->sp;
            in_RDI->sp = psVar12 + 1;
            *psVar12 = sVar1;
            if (local_f4 == (int)in_RDI->table[0][(int)local_f4]) {
              in_RDI->state = Error;
              local_6c = -1;
              goto LAB_00106bff;
            }
            if (0x1fff < (long)in_RDI->sp - (long)in_RDI->stack >> 1) {
              in_RDI->state = Error;
              local_6c = -1;
              goto LAB_00106bff;
            }
          }
          if ((int)local_f4 < 0) {
            in_RDI->state = Error;
            local_6c = -1;
            goto LAB_00106bff;
          }
          sVar1 = in_RDI->table[1][(int)local_f4];
          in_RDI->firstcode = (int)sVar1;
          psVar12 = in_RDI->sp;
          in_RDI->sp = psVar12 + 1;
          *psVar12 = sVar1;
          iVar11 = in_RDI->max_code;
          if (iVar11 < 0x1000) {
            in_RDI->table[0][iVar11] = (short)in_RDI->oldcode;
            in_RDI->table[1][iVar11] = (short)in_RDI->firstcode;
            in_RDI->max_code = in_RDI->max_code + 1;
            if ((in_RDI->max_code_size <= in_RDI->max_code) && (in_RDI->max_code_size < 0x1000)) {
              in_RDI->max_code_size = in_RDI->max_code_size << 1;
              in_RDI->code_size = in_RDI->code_size + 1;
            }
          }
          in_RDI->oldcode = in_RDI->incode;
          iVar11 = QImage::height();
          local_100 = (void *)0x0;
          if (((in_RDI->out_of_bounds & 1U) == 0) && (in_RDI->y < iVar11)) {
            local_100 = (void *)((long)local_b0 + in_RDI->y * local_a8);
          }
          while (in_RDI->stack < in_RDI->sp) {
            psVar12 = in_RDI->sp;
            in_RDI->sp = psVar12 + -1;
            bVar19 = (byte)psVar12[-1];
            if ((((in_RDI->out_of_bounds & 1U) == 0) && (in_RDI->y < iVar11)) &&
               ((in_RDI->frame == 0 || ((uint)bVar19 != in_RDI->trans_index)))) {
              QVar10 = color(in_RDI,bVar19);
              *(QRgb *)((long)local_100 + (long)in_RDI->x * 4) = QVar10;
            }
            in_RDI->x = in_RDI->x + 1;
            if (in_RDI->swidth <= in_RDI->x) {
              in_RDI->out_of_bounds = true;
            }
            if (in_RDI->left + in_RDI->width <= in_RDI->x) {
              in_RDI->x = in_RDI->left;
              in_stack_fffffffffffffe6e = true;
              if (in_RDI->left < in_RDI->swidth) {
                in_stack_fffffffffffffe6e = in_RDI->sheight <= in_RDI->y;
              }
              in_RDI->out_of_bounds = (bool)in_stack_fffffffffffffe6e;
              nextY((QGIFFormat *)
                    CONCAT17(in_stack_fffffffffffffe77,
                             CONCAT16(uVar21,CONCAT24(in_stack_fffffffffffffe74,
                                                      in_stack_fffffffffffffe70))),
                    (uchar *)CONCAT17(in_stack_fffffffffffffe6f,
                                      CONCAT16(in_stack_fffffffffffffe6e,
                                               CONCAT24(in_stack_fffffffffffffe6c,
                                                        in_stack_fffffffffffffe68))),
                    in_stack_fffffffffffffe64);
              if (((in_RDI->out_of_bounds & 1U) == 0) && (in_RDI->y < iVar11)) {
                local_100 = (void *)((long)local_b0 + in_RDI->y * local_a8);
              }
            }
          }
        }
        else {
          in_RDI->oldcode = local_f4;
          in_RDI->firstcode = local_f4;
          if ((((in_RDI->out_of_bounds & 1U) == 0) &&
              (iVar11 = QImage::height(), in_RDI->y < iVar11)) &&
             ((in_RDI->frame == 0 || (in_RDI->firstcode != in_RDI->trans_index)))) {
            QVar10 = color(in_RDI,(uchar)in_RDI->firstcode);
            *(QRgb *)((long)local_b0 + (long)in_RDI->x * 4 + in_RDI->y * local_a8) = QVar10;
          }
          in_RDI->x = in_RDI->x + 1;
          if (in_RDI->swidth <= in_RDI->x) {
            in_RDI->out_of_bounds = true;
          }
          in_RDI->needfirst = false;
          if (in_RDI->left + in_RDI->width <= in_RDI->x) {
            in_RDI->x = in_RDI->left;
            in_stack_fffffffffffffe6f = true;
            if (in_RDI->left < in_RDI->swidth) {
              in_stack_fffffffffffffe6f = in_RDI->sheight <= in_RDI->y;
            }
            in_RDI->out_of_bounds = (bool)in_stack_fffffffffffffe6f;
            nextY((QGIFFormat *)
                  CONCAT17(in_stack_fffffffffffffe77,
                           CONCAT16(uVar21,CONCAT24(in_stack_fffffffffffffe74,
                                                    in_stack_fffffffffffffe70))),
                  (uchar *)CONCAT17(in_stack_fffffffffffffe6f,
                                    CONCAT16(in_stack_fffffffffffffe6e,
                                             CONCAT24(in_stack_fffffffffffffe6c,
                                                      in_stack_fffffffffffffe68))),
                  in_stack_fffffffffffffe64);
          }
        }
      }
      in_RDI->partialNewFrame = true;
      if (in_RDI->count == in_RDI->expectcount) {
        in_RDI->count = 0;
        in_RDI->state = ImageDataBlockSize;
      }
      in_stack_fffffffffffffe76 = 0;
      break;
    case ExtensionLabel:
      in_stack_fffffffffffffe68 = (uint)bVar19;
      if (in_stack_fffffffffffffe68 == 0xf9) {
        in_RDI->state = GraphicControlExtension;
      }
      else if (in_stack_fffffffffffffe68 == 0xff) {
        in_RDI->state = ApplicationExtension;
      }
      else {
        in_RDI->state = SkipBlockSize;
      }
      in_RDI->count = 0;
      break;
    case GraphicControlExtension:
      if (in_RDI->count < 5) {
        in_RDI->hold[in_RDI->count] = bVar19;
      }
      in_RDI->count = in_RDI->count + 1;
      if (in_RDI->count == in_RDI->hold[0] + 1) {
        disposePrevious(in_stack_fffffffffffffea8,
                        (QImage *)CONCAT44(in_stack_fffffffffffffea4,in_stack_fffffffffffffea0));
        in_stack_fffffffffffffe64 = (int)(uint)in_RDI->hold[1] >> 2 & 7;
        if (RestoreImage < in_stack_fffffffffffffe64) {
          in_stack_fffffffffffffe64 = NoDisposal;
        }
        in_RDI->disposal = in_stack_fffffffffffffe64;
        if (in_RDI->count < 4) {
          in_stack_fffffffffffffe60 = 1;
        }
        else {
          in_stack_fffffffffffffe60 = (uint)*(ushort *)(in_RDI->hold + 2);
        }
        in_stack_fffffffffffffe5c = in_stack_fffffffffffffe60;
        if (in_stack_fffffffffffffe60 < 2) {
          in_stack_fffffffffffffe5c = 10;
        }
        *in_R8 = in_stack_fffffffffffffe5c * 10;
        if ((in_RDI->hold[1] & 1) == 0) {
          in_stack_fffffffffffffe58 = 0xffffffff;
        }
        else {
          in_stack_fffffffffffffe58 = (uint)in_RDI->hold[4];
        }
        in_RDI->trans_index = in_stack_fffffffffffffe58;
        in_RDI->count = 0;
        in_RDI->state = SkipBlockSize;
      }
      break;
    case ApplicationExtension:
      if (in_RDI->count < 0xb) {
        in_RDI->hold[in_RDI->count] = bVar19;
      }
      in_RDI->count = in_RDI->count + 1;
      if (in_RDI->count == in_RDI->hold[0] + 1) {
        iVar11 = qstrncmp((char *)CONCAT44(in_stack_fffffffffffffe64,in_stack_fffffffffffffe60),
                          (char *)CONCAT44(in_stack_fffffffffffffe5c,in_stack_fffffffffffffe58),
                          CONCAT44(in_stack_fffffffffffffe54,in_stack_fffffffffffffe50));
        if (iVar11 == 0) {
          in_RDI->state = NetscapeExtensionBlockSize;
        }
        else {
          in_RDI->state = SkipBlockSize;
        }
        in_RDI->count = 0;
      }
      break;
    case NetscapeExtensionBlockSize:
      in_RDI->expectcount = (uint)bVar19;
      in_RDI->count = 0;
      if (in_RDI->expectcount == 0) {
        in_RDI->state = Introducer;
      }
      else {
        in_RDI->state = NetscapeExtensionBlock;
      }
      break;
    case NetscapeExtensionBlock:
      if (in_RDI->count < 3) {
        in_RDI->hold[in_RDI->count] = bVar19;
      }
      in_RDI->count = in_RDI->count + 1;
      if (in_RDI->count == in_RDI->expectcount) {
        *in_R9 = (uint)in_RDI->hold[1] + (uint)in_RDI->hold[2] * 0x100;
        in_RDI->state = SkipBlockSize;
      }
      break;
    case SkipBlockSize:
      in_RDI->expectcount = (uint)bVar19;
      in_RDI->count = 0;
      if (in_RDI->expectcount == 0) {
        in_RDI->state = Introducer;
      }
      else {
        in_RDI->state = SkipBlock;
      }
      break;
    case SkipBlock:
      in_RDI->count = in_RDI->count + 1;
      if (in_RDI->count == in_RDI->expectcount) {
        in_RDI->state = SkipBlockSize;
      }
      break;
    case Done:
      in_RDI->digress = true;
      break;
    case Error:
      local_6c = -1;
LAB_00106bff:
      if (*(long *)(in_FS_OFFSET + 0x28) != local_8) {
        __stack_chk_fail();
      }
      return local_6c;
    }
  } while( true );
}

Assistant:

int QGIFFormat::decode(QImage *image, const uchar *buffer, int length,
                       int *nextFrameDelay, int *loopCount)
{
    // We are required to state that
    //    "The Graphics Interchange Format(c) is the Copyright property of
    //    CompuServe Incorporated. GIF(sm) is a Service Mark property of
    //    CompuServe Incorporated."

    if (!stack) {
        stack = new short[(1 << max_lzw_bits) * 4];
        table[0] = &stack[(1 << max_lzw_bits) * 2];
        table[1] = &stack[(1 << max_lzw_bits) * 3];
    }

    image->detach();
    qsizetype bpl = image->bytesPerLine();
    unsigned char *bits = image->bits();

#define LM(l, m) (((m)<<8)|l)
    digress = false;
    const int initial = length;
    while (!digress && length) {
        length--;
        unsigned char ch=*buffer++;
        switch (state) {
          case Header:
            hold[count++]=ch;
            if (count==6) {
                // Header
                gif89=(hold[3]!='8' || hold[4]!='7');
                state=LogicalScreenDescriptor;
                count=0;
            }
            break;
          case LogicalScreenDescriptor:
            hold[count++]=ch;
            if (count==7) {
                // Logical Screen Descriptor
                swidth=LM(hold[0], hold[1]);
                sheight=LM(hold[2], hold[3]);
                gcmap=!!(hold[4]&0x80);
                //UNUSED: bpchan=(((hold[4]&0x70)>>3)+1);
                //UNUSED: gcmsortflag=!!(hold[4]&0x08);
                gncols=2<<(hold[4]&0x7);
                bgcol=(gcmap) ? hold[5] : -1;
                //aspect=hold[6] ? double(hold[6]+15)/64.0 : 1.0;

                trans_index = -1;
                count=0;
                ncols=gncols;
                if (gcmap) {
                    ccount=0;
                    state=GlobalColorMap;
                    globalcmap = new QRgb[gncols+1]; // +1 for trans_index
                    globalcmap[gncols] = Q_TRANSPARENT;
                } else {
                    state=Introducer;
                }
            }
            break;
          case GlobalColorMap: case LocalColorMap:
            hold[count++]=ch;
            if (count==3) {
                QRgb rgb = qRgb(hold[0], hold[1], hold[2]);
                if (state == LocalColorMap) {
                    if (ccount < lncols)
                        localcmap[ccount] =  rgb;
                } else {
                    globalcmap[ccount] = rgb;
                }
                if (++ccount >= ncols) {
                    if (state == LocalColorMap)
                        state=TableImageLZWSize;
                    else
                        state=Introducer;
                }
                count=0;
            }
            break;
          case Introducer:
            hold[count++]=ch;
            switch (ch) {
              case ',':
                state=ImageDescriptor;
                break;
              case '!':
                state=ExtensionLabel;
                break;
              case ';':
                  // ### Changed: QRect(0, 0, swidth, sheight)
                state=Done;
                break;
              default:
                digress=true;
                // Unexpected Introducer - ignore block
                state=Error;
            }
            break;
          case ImageDescriptor:
            hold[count++]=ch;
            if (count==10) {
                int newleft=LM(hold[1], hold[2]);
                int newtop=LM(hold[3], hold[4]);
                int newwidth=LM(hold[5], hold[6]);
                int newheight=LM(hold[7], hold[8]);

                // disbelieve ridiculous logical screen sizes,
                // unless the image frames are also large.
                if (swidth/10 > qMax(newwidth,16384))
                    swidth = -1;
                if (sheight/10 > qMax(newheight,16384))
                    sheight = -1;

                if (swidth <= 0)
                    swidth = newleft + newwidth;
                if (sheight <= 0)
                    sheight = newtop + newheight;

                QImage::Format format = trans_index >= 0 ? QImage::Format_ARGB32 : QImage::Format_RGB32;
                if (image->isNull()) {
                    if (!withinSizeLimit(swidth, sheight)) {
                        state = Error;
                        return -1;
                    }
                    if (!QImageIOHandler::allocateImage(QSize(swidth, sheight), format, image)) {
                        state = Error;
                        return -1;
                    }
                    bpl = image->bytesPerLine();
                    bits = image->bits();
                    if (bits)
                        memset(bits, 0, image->sizeInBytes());
                }

                // Check if the previous attempt to create the image failed. If it
                // did then the image is broken and we should give up.
                if (image->isNull()) {
                    state = Error;
                    return -1;
                }

                disposePrevious(image);
                disposed = false;

                left = newleft;
                top = newtop;
                width = newwidth;
                height = newheight;

                right=qMax(0, qMin(left+width, swidth)-1);
                bottom=qMax(0, qMin(top+height, sheight)-1);
                lcmap=!!(hold[9]&0x80);
                interlace=!!(hold[9]&0x40);
                //bool lcmsortflag=!!(hold[9]&0x20);
                lncols=lcmap ? (2<<(hold[9]&0x7)) : 0;
                if (lncols) {
                    if (localcmap)
                        delete [] localcmap;
                    localcmap = new QRgb[lncols+1];
                    localcmap[lncols] = Q_TRANSPARENT;
                    ncols = lncols;
                } else {
                    ncols = gncols;
                }
                frame++;
                if (frame == 0) {
                    if (left || top || width<swidth || height<sheight) {
                        // Not full-size image - erase with bg or transparent
                        if (trans_index >= 0) {
                            fillRect(image, 0, 0, swidth, sheight, color(trans_index));
                            // ### Changed: QRect(0, 0, swidth, sheight)
                        } else if (bgcol>=0) {
                            fillRect(image, 0, 0, swidth, sheight, color(bgcol));
                            // ### Changed: QRect(0, 0, swidth, sheight)
                        }
                    }
                }

                if (disposal == RestoreImage) {
                    int l = qMin(swidth-1,left);
                    int r = qMin(swidth-1,right);
                    int t = qMin(sheight-1,top);
                    int b = qMin(sheight-1,bottom);
                    int w = r-l+1;
                    int h = b-t+1;

                    if (backingstore.width() < w
                        || backingstore.height() < h) {

                        if (!withinSizeLimit(w, h)) {
                            state = Error;
                            return -1;
                        }
                        // We just use the backing store as a byte array
                        QSize bsSize(qMax(backingstore.width(), w), qMax(backingstore.height(), h));
                        if (!QImageIOHandler::allocateImage(bsSize, QImage::Format_RGB32,
                                                            &backingstore)) {
                            state = Error;
                            return -1;
                        }
                        memset(backingstore.bits(), 0, backingstore.sizeInBytes());
                    }
                    const qsizetype dest_bpl = backingstore.bytesPerLine();
                    unsigned char *dest_data = backingstore.bits();
                    for (int ln=0; ln<h; ln++) {
                        memcpy(FAST_SCAN_LINE(dest_data, dest_bpl, ln),
                               FAST_SCAN_LINE(bits, bpl, t+ln) + l*sizeof(QRgb), w*sizeof(QRgb));
                    }
                }

                count=0;
                if (lcmap) {
                    ccount=0;
                    state=LocalColorMap;
                } else {
                    state=TableImageLZWSize;
                }
                x = left;
                y = top;
                accum = 0;
                bitcount = 0;
                sp = stack;
                firstcode = oldcode = 0;
                needfirst = true;
                out_of_bounds = left>=swidth || y>=sheight;
            }
            break;
          case TableImageLZWSize: {
            lzwsize=ch;
            if (lzwsize > max_lzw_bits) {
                state=Error;
            } else {
                code_size=lzwsize+1;
                clear_code=1<<lzwsize;
                end_code=clear_code+1;
                max_code_size=2*clear_code;
                max_code=clear_code+2;
                int i;
                for (i=0; i<clear_code; i++) {
                    table[0][i]=0;
                    table[1][i]=i;
                }
                state=ImageDataBlockSize;
            }
            count=0;
            break;
          } case ImageDataBlockSize:
            expectcount=ch;
            if (expectcount) {
                state=ImageDataBlock;
            } else {
                state=Introducer;
                digress = true;
                newFrame = true;
            }
            break;
          case ImageDataBlock:
            count++;
            if (bitcount != -32768) {
                if (bitcount < 0 || bitcount > 31) {
                    state = Error;
                    return -1;
                }
                accum |= (ch << bitcount);
                bitcount += 8;
            }
            while (bitcount>=code_size && state==ImageDataBlock) {
                int code=accum&((1<<code_size)-1);
                bitcount-=code_size;
                accum>>=code_size;

                if (code==clear_code) {
                    if (!needfirst) {
                        code_size=lzwsize+1;
                        max_code_size=2*clear_code;
                        max_code=clear_code+2;
                    }
                    needfirst=true;
                } else if (code==end_code) {
                    bitcount = -32768;
                    // Left the block end arrive
                } else {
                    if (needfirst) {
                        firstcode=oldcode=code;
                        if (!out_of_bounds && image->height() > y && ((frame == 0) || (firstcode != trans_index)))
                            ((QRgb*)FAST_SCAN_LINE(bits, bpl, y))[x] = color(firstcode);
                        x++;
                        if (x>=swidth) out_of_bounds = true;
                        needfirst=false;
                        if (x>=left+width) {
                            x=left;
                            out_of_bounds = left>=swidth || y>=sheight;
                            nextY(bits, bpl);
                        }
                    } else {
                        incode=code;
                        if (code>=max_code) {
                            *sp++=firstcode;
                            code=oldcode;
                        }
                        while (code>=clear_code+2) {
                            if (code >= max_code) {
                                state = Error;
                                return -1;
                            }
                            *sp++=table[1][code];
                            if (code==table[0][code]) {
                                state=Error;
                                return -1;
                            }
                            if (sp-stack>=(1<<(max_lzw_bits))*2) {
                                state=Error;
                                return -1;
                            }
                            code=table[0][code];
                        }
                        if (code < 0) {
                            state = Error;
                            return -1;
                        }

                        *sp++=firstcode=table[1][code];
                        code=max_code;
                        if (code<(1<<max_lzw_bits)) {
                            table[0][code]=oldcode;
                            table[1][code]=firstcode;
                            max_code++;
                            if ((max_code>=max_code_size)
                             && (max_code_size<(1<<max_lzw_bits)))
                            {
                                max_code_size*=2;
                                code_size++;
                            }
                        }
                        oldcode=incode;
                        const int h = image->height();
                        QRgb *line = nullptr;
                        if (!out_of_bounds && h > y)
                            line = (QRgb*)FAST_SCAN_LINE(bits, bpl, y);
                        while (sp>stack) {
                            const uchar index = *(--sp);
                            if (!out_of_bounds && h > y && ((frame == 0) || (index != trans_index))) {
                                line[x] = color(index);
                            }
                            x++;
                            if (x>=swidth) out_of_bounds = true;
                            if (x>=left+width) {
                                x=left;
                                out_of_bounds = left>=swidth || y>=sheight;
                                nextY(bits, bpl);
                                if (!out_of_bounds && h > y)
                                    line = (QRgb*)FAST_SCAN_LINE(bits, bpl, y);
                            }
                        }
                    }
                }
            }
            partialNewFrame = true;
            if (count==expectcount) {
                count=0;
                state=ImageDataBlockSize;
            }
            break;
          case ExtensionLabel:
            switch (ch) {
            case 0xf9:
                state=GraphicControlExtension;
                break;
            case 0xff:
                state=ApplicationExtension;
                break;
#if 0
            case 0xfe:
                state=CommentExtension;
                break;
            case 0x01:
                break;
#endif
            default:
                state=SkipBlockSize;
            }
            count=0;
            break;
          case ApplicationExtension:
            if (count<11) hold[count]=ch;
            count++;
            if (count==hold[0]+1) {
                if (qstrncmp((char*)(hold+1), "NETSCAPE", 8)==0) {
                    // Looping extension
                    state=NetscapeExtensionBlockSize;
                } else {
                    state=SkipBlockSize;
                }
                count=0;
            }
            break;
          case NetscapeExtensionBlockSize:
            expectcount=ch;
            count=0;
            if (expectcount) state=NetscapeExtensionBlock;
            else state=Introducer;
            break;
          case NetscapeExtensionBlock:
            if (count<3) hold[count]=ch;
            count++;
            if (count==expectcount) {
                *loopCount = hold[1]+hold[2]*256;
                state=SkipBlockSize; // Ignore further blocks
            }
            break;
          case GraphicControlExtension:
            if (count<5) hold[count]=ch;
            count++;
            if (count==hold[0]+1) {
                disposePrevious(image);
                uint dBits = (hold[1] >> 2) & 0x7;
                disposal = (dBits <= RestoreImage) ? Disposal(dBits) : NoDisposal;
                //UNUSED: waitforuser=!!((hold[1]>>1)&0x1);
                int delay=count>3 ? LM(hold[2], hold[3]) : 1;
                // IE and mozilla use a minimum delay of 10. With the minimum delay of 10
                // we are compatible to them and avoid huge loads on the app and xserver.
                *nextFrameDelay = (delay < 2 ? 10 : delay) * 10;

                bool havetrans=hold[1]&0x1;
                trans_index = havetrans ? hold[4] : -1;

                count=0;
                state=SkipBlockSize;
            }
            break;
          case SkipBlockSize:
            expectcount=ch;
            count=0;
            if (expectcount) state=SkipBlock;
            else state=Introducer;
            break;
          case SkipBlock:
            count++;
            if (count==expectcount) state=SkipBlockSize;
            break;
          case Done:
            digress=true;
            /* Netscape ignores the junk, so we do too.
            length++; // Unget
            state=Error; // More calls to this is an error
            */
            break;
          case Error:
            return -1; // Called again after done.
        }
    }
    return initial-length;
}